

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O0

void printBinaryCode(vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *code,
                    int bitWidth)

{
  bool bVar1;
  const_reference this;
  __type _Var2;
  int local_1c;
  int local_18;
  int i;
  int j;
  int bitWidth_local;
  vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *code_local;
  
  for (local_18 = 0; local_18 < bitWidth; local_18 = local_18 + 1) {
    local_1c = 0;
    while( true ) {
      _Var2 = std::pow<int,int>(2,bitWidth);
      if (_Var2 <= (double)local_1c) break;
      this = std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::operator[]
                       (code,(long)local_1c);
      bVar1 = std::bitset<20UL>::operator[](this,(long)local_18);
      std::ostream::operator<<((ostream *)&std::cout,bVar1);
      local_1c = local_1c + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printBinaryCode(const std::vector<std::bitset<20> >& code, int bitWidth)
{
	for(int j = 0; j < bitWidth; ++j)
	{
		for(int i = 0; i < pow(2, bitWidth); i++)
		{
		    std::cout << code[i][j];
		}
		std::cout << std::endl;
	}
	std::cout << std::endl;
}